

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoserver.hpp
# Opt level: O3

void __thiscall
EOServer::EOServer(EOServer *this,IPAddress addr,unsigned_short port,
                  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
                  *dbinfo,Config *eoserv_config,Config *admin_config)

{
  long *plVar1;
  long lVar2;
  long *plVar3;
  string *psVar4;
  long lVar5;
  IPAddress local_f4;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
  local_f0;
  
  local_f4.address = addr.address;
  Server::Server(&this->super_Server,&local_f4,port);
  (this->super_Server)._vptr_Server = (_func_int **)&PTR_ClientFactory_001d1820;
  (this->connection_log)._M_h._M_buckets = &(this->connection_log)._M_h._M_single_bucket;
  (this->connection_log)._M_h._M_bucket_count = 1;
  (this->connection_log)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->connection_log)._M_h._M_element_count = 0;
  (this->connection_log)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this->QuietConnectionErrors = false;
  (this->connection_log)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->connection_log)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->ping_timer = (TimeEvent *)0x0;
  this->HangupDelay = 10.0;
  lVar5 = 0x10;
  psVar4 = (string *)&local_f0;
  do {
    *(string **)psVar4 = psVar4 + 0x10;
    lVar2 = *(long *)((long)dbinfo->_M_elems + lVar5 + -0x10);
    std::__cxx11::string::_M_construct<char*>
              (psVar4,lVar2,*(long *)((long)dbinfo->_M_elems + lVar5 + -8) + lVar2);
    lVar5 = lVar5 + 0x20;
    psVar4 = psVar4 + 0x20;
  } while (lVar5 != 0xd0);
  Initialize(this,&local_f0,eoserv_config,admin_config);
  lVar5 = 0;
  do {
    plVar3 = *(long **)((long)&local_f0._M_elems[5]._M_dataplus._M_p + lVar5);
    plVar1 = (long *)(local_f0._M_elems[5].field_2._M_local_buf + lVar5);
    if (plVar1 != plVar3) {
      operator_delete(plVar3,*plVar1 + 1);
    }
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0xc0);
  return;
}

Assistant:

EOServer(IPAddress addr, unsigned short port, std::array<std::string, 6> dbinfo, const Config &eoserv_config, const Config &admin_config) : Server(addr, port)
		{
			this->Initialize(dbinfo, eoserv_config, admin_config);
		}